

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O0

void __thiscall
duckdb::roaring::ContainerMetadataCollection::AddArrayContainer
          (ContainerMetadataCollection *this,idx_t amount,bool is_inverted)

{
  ContainerMetadataCollection *in_RDI;
  undefined8 in_stack_ffffffffffffffd8;
  vector<unsigned_char,_true> *__x;
  
  AddContainerType(in_RDI,SUB81((ulong)in_stack_ffffffffffffffd8 >> 0x38,0),
                   SUB81((ulong)in_stack_ffffffffffffffd8 >> 0x30,0));
  __x = &in_RDI->cardinality;
  NumericCast<unsigned_char,unsigned_long,void>(0xa056f7);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,
             (value_type_conflict4 *)__x);
  in_RDI->arrays_in_segment = in_RDI->arrays_in_segment + 1;
  in_RDI->count_in_segment = in_RDI->count_in_segment + 1;
  return;
}

Assistant:

void ContainerMetadataCollection::AddArrayContainer(idx_t amount, bool is_inverted) {
	AddContainerType(false, is_inverted);
	D_ASSERT(amount < MAX_ARRAY_IDX);
	cardinality.push_back(NumericCast<uint8_t>(amount));
	arrays_in_segment++;
	count_in_segment++;
}